

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestRspFileSuccess::Run(BuildTestRspFileSuccess *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  Test *pTVar5;
  bool bVar6;
  Node *pNVar7;
  size_type sVar8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $long_command\nrule cat_rsp_out\n  command = cat $rspfile > $out\n  rspfile = $out.rsp\n  rspfile_content = $long_command\nbuild out1: cat in\nbuild out2: cat_rsp in\n  rspfile = out 2.rsp\n  long_command = Some very long command\nbuild out$ 3: cat_rsp_out in\n  long_command = Some very long command\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out1",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out2",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out 3",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_BuildTest).fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"in",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar5 = g_current_test;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out1",&local_72);
  this_01 = &(this->super_BuildTest).builder_;
  pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
  testing::Test::Check
            (pTVar5,pNVar7 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0x668,"builder_.AddTarget(\"out1\", &err)");
  std::__cxx11::string::~string((string *)&local_70);
  pTVar5 = g_current_test;
  bVar6 = std::operator==("",&local_50);
  bVar6 = testing::Test::Check
                    (pTVar5,bVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x669,"\"\" == err");
  pTVar5 = g_current_test;
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out2",&local_72);
    pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
    testing::Test::Check
              (pTVar5,pNVar7 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x66a,"builder_.AddTarget(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar5 = g_current_test;
    bVar6 = std::operator==("",&local_50);
    bVar6 = testing::Test::Check
                      (pTVar5,bVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x66b,"\"\" == err");
    pTVar5 = g_current_test;
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out 3",&local_72);
      pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
      testing::Test::Check
                (pTVar5,pNVar7 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x66c,"builder_.AddTarget(\"out 3\", &err)");
      std::__cxx11::string::~string((string *)&local_70);
      pTVar5 = g_current_test;
      bVar6 = std::operator==("",&local_50);
      bVar6 = testing::Test::Check
                        (pTVar5,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x66d,"\"\" == err");
      pTVar5 = g_current_test;
      if (bVar6) {
        sVar3 = (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
        sVar4 = (this->super_BuildTest).fs_.files_created_._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
        bVar6 = Builder::Build(this_01,&local_50);
        testing::Test::Check
                  (pTVar5,bVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x672,"builder_.Build(&err)");
        bVar6 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x60,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x673,"3u == command_runner_.commands_ran_.size()");
        if ((bVar6) &&
           (bVar6 = testing::Test::Check
                              (g_current_test,
                               sVar4 + 2 ==
                               (this->super_BuildTest).fs_.files_created_._M_t._M_impl.
                               super__Rb_tree_header._M_node_count,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x676,"files_created + 2 == fs_.files_created_.size()"),
           pTVar5 = g_current_test, bVar6)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"out 2.rsp",&local_72);
          psVar9 = &(this->super_BuildTest).fs_.files_created_;
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(psVar9,&local_70);
          bVar6 = testing::Test::Check
                            (pTVar5,sVar8 == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x677,"1u == fs_.files_created_.count(\"out 2.rsp\")");
          std::__cxx11::string::~string((string *)&local_70);
          pTVar5 = g_current_test;
          if (bVar6) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"out 3.rsp",&local_72);
            sVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(psVar9,&local_70);
            bVar6 = testing::Test::Check
                              (pTVar5,sVar8 == 1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x678,"1u == fs_.files_created_.count(\"out 3.rsp\")");
            std::__cxx11::string::~string((string *)&local_70);
            if ((bVar6) &&
               (bVar6 = testing::Test::Check
                                  (g_current_test,
                                   sVar3 + 2 ==
                                   (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                   ,0x67b,"files_removed + 2 == fs_.files_removed_.size()"),
               pTVar5 = g_current_test, bVar6)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"out 2.rsp",&local_72);
              psVar9 = &(this->super_BuildTest).fs_.files_removed_;
              sVar8 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(psVar9,&local_70);
              bVar6 = testing::Test::Check
                                (pTVar5,sVar8 == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x67c,"1u == fs_.files_removed_.count(\"out 2.rsp\")");
              std::__cxx11::string::~string((string *)&local_70);
              pTVar5 = g_current_test;
              if (bVar6) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_70,"out 3.rsp",&local_72);
                sVar8 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(psVar9,&local_70);
                bVar6 = testing::Test::Check
                                  (pTVar5,sVar8 == 1,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                   ,0x67d,"1u == fs_.files_removed_.count(\"out 3.rsp\")");
                std::__cxx11::string::~string((string *)&local_70);
                if (bVar6) goto LAB_00128570;
              }
            }
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00128570:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(BuildTest, RspFileSuccess)
{
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule cat_rsp\n"
    "  command = cat $rspfile > $out\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "rule cat_rsp_out\n"
    "  command = cat $rspfile > $out\n"
    "  rspfile = $out.rsp\n"
    "  rspfile_content = $long_command\n"
    "build out1: cat in\n"
    "build out2: cat_rsp in\n"
    "  rspfile = out 2.rsp\n"
    "  long_command = Some very long command\n"
    "build out$ 3: cat_rsp_out in\n"
    "  long_command = Some very long command\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("out 3", "");

  fs_.Tick();

  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AddTarget("out 3", &err));
  ASSERT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  size_t files_removed = fs_.files_removed_.size();

  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());

  // The RSP files were created
  ASSERT_EQ(files_created + 2, fs_.files_created_.size());
  ASSERT_EQ(1u, fs_.files_created_.count("out 2.rsp"));
  ASSERT_EQ(1u, fs_.files_created_.count("out 3.rsp"));

  // The RSP files were removed
  ASSERT_EQ(files_removed + 2, fs_.files_removed_.size());
  ASSERT_EQ(1u, fs_.files_removed_.count("out 2.rsp"));
  ASSERT_EQ(1u, fs_.files_removed_.count("out 3.rsp"));
}